

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitObjectInitializers
               (ParseNode *memberList,RegSlot objectLocation,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  uint uVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar2;
  ParseNode *this;
  code *pcVar3;
  OpCode OVar4;
  bool bVar5;
  bool bVar6;
  BOOL BVar7;
  uint C1;
  BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  ParseNodeBin *pPVar8;
  ParseNodeStr *pPVar9;
  undefined4 *puVar10;
  PropertyIdArray *obj;
  FunctionBody *this_01;
  ulong uVar11;
  ParseNodePtr pPVar12;
  uint uVar13;
  bool *in_stack_ffffffffffffff88;
  uint32 local_40;
  Type local_3c;
  uint32 value;
  Type local_34 [2];
  PropertyId propertyId;
  
  value = objectLocation;
  this_00 = (BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)new<Memory::ArenaAllocator>(0x38,byteCodeGenerator->alloc,0x364470);
  JsUtil::
  BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_00,byteCodeGenerator->alloc,0x11);
  if (memberList != (ParseNode *)0x0) {
    OVar4 = memberList->nop;
    pPVar12 = memberList;
    if (OVar4 == knopList) {
      do {
        pPVar8 = ParseNode::AsParseNodeBin(pPVar12);
        if (pPVar8->pnode1->nop == knopEllipsis) {
LAB_008119a6:
          OVar4 = pPVar12->nop;
          bVar6 = true;
          goto LAB_008119ad;
        }
        pPVar8 = ParseNode::AsParseNodeBin(pPVar12);
        pPVar8 = ParseNode::AsParseNodeBin(pPVar8->pnode1);
        if (pPVar8->pnode1->nop == knopComputedName) goto LAB_008119a6;
        pPVar8 = ParseNode::AsParseNodeBin(pPVar12);
        pPVar8 = ParseNode::AsParseNodeBin(pPVar8->pnode1);
        pPVar9 = ParseNode::AsParseNodeStr(pPVar8->pnode1);
        local_34[0] = pPVar9->pid->m_propertyId;
        BVar7 = Js::ScriptContext::IsNumericPropertyId
                          (byteCodeGenerator->scriptContext,local_34[0],&local_40);
        if (BVar7 == 0) {
          local_3c = local_34[0];
          JsUtil::
          BaseDictionary<int,int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<int,int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                    ((BaseDictionary<int,int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                      *)this_00,(int *)&local_3c,(int *)local_34);
        }
        pPVar8 = ParseNode::AsParseNodeBin(pPVar12);
        pPVar12 = pPVar8->pnode2;
        OVar4 = pPVar12->nop;
      } while (OVar4 == knopList);
      bVar6 = false;
    }
    else {
      bVar6 = false;
    }
LAB_008119ad:
    if ((OVar4 != knopEllipsis) &&
       (pPVar8 = ParseNode::AsParseNodeBin(pPVar12),
       pPVar8->pnode1->nop != knopComputedName && !bVar6)) {
      pPVar8 = ParseNode::AsParseNodeBin(pPVar12);
      pPVar9 = ParseNode::AsParseNodeStr(pPVar8->pnode1);
      local_34[0] = pPVar9->pid->m_propertyId;
      BVar7 = Js::ScriptContext::IsNumericPropertyId
                        (byteCodeGenerator->scriptContext,local_34[0],&local_40);
      if (BVar7 == 0) {
        local_3c = local_34[0];
        JsUtil::
        BaseDictionary<int,int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<int,int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                  ((BaseDictionary<int,int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                    *)this_00,(int *)&local_3c,(int *)local_34);
      }
    }
    uVar13 = this_00->count - this_00->freeCount;
    if (uVar13 != 0) {
      if (0x3fffffff < uVar13) {
LAB_00811e00:
        Math::DefaultOverflowPolicy();
      }
      pAVar2 = &byteCodeGenerator->alloc->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      BVar7 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar7 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar5) goto LAB_00811e05;
        *puVar10 = 0;
      }
      uVar1 = uVar13 * 4;
      obj = (PropertyIdArray *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            AllocInternal(pAVar2,(ulong)uVar1 + 8);
      if (obj == (PropertyIdArray *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x20d,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar5) {
LAB_00811e05:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar10 = 0;
      }
      obj->count = uVar13;
      obj->extraSlots = '\0';
      obj->hadDuplicates = false;
      obj->has__proto__ = false;
      obj->hasNonSimpleParams = false;
      local_3c = 0x1eb;
      bVar5 = JsUtil::
              BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(this_00,(int *)&local_3c);
      if (bVar5) {
        obj->has__proto__ = true;
      }
      OVar4 = memberList->nop;
      uVar11 = 0;
      pPVar12 = memberList;
      if (OVar4 == knopList) {
        uVar11 = 0;
        do {
          pPVar8 = ParseNode::AsParseNodeBin(pPVar12);
          if (pPVar8->pnode1->nop == knopEllipsis) {
LAB_00811c0b:
            OVar4 = pPVar12->nop;
            break;
          }
          pPVar8 = ParseNode::AsParseNodeBin(pPVar12);
          pPVar8 = ParseNode::AsParseNodeBin(pPVar8->pnode1);
          if (pPVar8->pnode1->nop == knopComputedName) goto LAB_00811c0b;
          pPVar8 = ParseNode::AsParseNodeBin(pPVar12);
          pPVar8 = ParseNode::AsParseNodeBin(pPVar8->pnode1);
          pPVar9 = ParseNode::AsParseNodeStr(pPVar8->pnode1);
          local_34[0] = pPVar9->pid->m_propertyId;
          BVar7 = Js::ScriptContext::IsNumericPropertyId
                            (byteCodeGenerator->scriptContext,local_34[0],&local_40);
          if (BVar7 == 0) {
            local_3c = local_34[0];
            bVar5 = JsUtil::
                    BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    ::Remove(this_00,(int *)&local_3c);
            if (bVar5) {
              (&obj[1].count)[uVar11] = local_34[0];
              uVar11 = (ulong)((int)uVar11 + 1);
            }
          }
          pPVar8 = ParseNode::AsParseNodeBin(pPVar12);
          pPVar12 = pPVar8->pnode2;
          OVar4 = pPVar12->nop;
        } while (OVar4 == knopList);
      }
      if ((OVar4 != knopEllipsis) &&
         (pPVar8 = ParseNode::AsParseNodeBin(pPVar12),
         !bVar6 && pPVar8->pnode1->nop != knopComputedName)) {
        pPVar8 = ParseNode::AsParseNodeBin(pPVar12);
        pPVar9 = ParseNode::AsParseNodeStr(pPVar8->pnode1);
        local_34[0] = pPVar9->pid->m_propertyId;
        BVar7 = Js::ScriptContext::IsNumericPropertyId
                          (byteCodeGenerator->scriptContext,local_34[0],&local_40);
        if (BVar7 == 0) {
          local_3c = local_34[0];
          bVar6 = JsUtil::
                  BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::Remove(this_00,(int *)&local_3c);
          if (bVar6) {
            (&obj[1].count)[uVar11] = local_34[0];
          }
        }
      }
      this_01 = FuncInfo::GetParsedFunctionBody(funcInfo);
      C1 = Js::FunctionBody::NewObjectLiteral(this_01);
      if (0x3ffffffd < uVar13) goto LAB_00811e00;
      Js::ByteCodeWriter::Auxiliary
                (&byteCodeGenerator->m_writer,NewScObjectLiteral,value,obj,uVar1 + 8,C1);
      pAVar2 = &byteCodeGenerator->alloc->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      JsUtil::
      BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::~BaseDictionary(this_00);
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                (pAVar2,this_00,0x38);
      Memory::
      DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::PropertyIdArray>
                (byteCodeGenerator->alloc,obj,(ulong)uVar1);
      goto LAB_00811cec;
    }
  }
  Js::ByteCodeWriter::Reg1(&byteCodeGenerator->m_writer,NewScObjectSimple,value);
LAB_00811cec:
  if (memberList != (ParseNode *)0x0) {
    if (memberList->nop == knopList) {
      bVar6 = false;
      do {
        pPVar8 = ParseNode::AsParseNodeBin(memberList);
        this = pPVar8->pnode1;
        if (this->nop == knopEllipsis) {
          ByteCodeGenerator::StartSubexpression(byteCodeGenerator,this);
          EmitObjectSpreadNode(this,value,byteCodeGenerator,funcInfo);
        }
        else {
          pPVar8 = ParseNode::AsParseNodeBin(this);
          if (pPVar8->pnode1->nop == knopComputedName) {
            bVar6 = true;
          }
          ByteCodeGenerator::StartSubexpression(byteCodeGenerator,this);
          EmitMemberNode(this,value,byteCodeGenerator,funcInfo,(ParseNode *)0x0,bVar6,
                         in_stack_ffffffffffffff88);
        }
        Js::ByteCodeWriter::EndSubexpression(&byteCodeGenerator->m_writer,this);
        pPVar8 = ParseNode::AsParseNodeBin(memberList);
        memberList = pPVar8->pnode2;
      } while (memberList->nop == knopList);
    }
    else {
      bVar6 = false;
    }
    ByteCodeGenerator::StartSubexpression(byteCodeGenerator,memberList);
    if (memberList->nop == knopEllipsis) {
      EmitObjectSpreadNode(memberList,value,byteCodeGenerator,funcInfo);
    }
    else {
      EmitMemberNode(memberList,value,byteCodeGenerator,funcInfo,(ParseNode *)0x0,bVar6,
                     in_stack_ffffffffffffff88);
    }
    Js::ByteCodeWriter::EndSubexpression(&byteCodeGenerator->m_writer,memberList);
  }
  return;
}

Assistant:

void EmitObjectInitializers(ParseNode *memberList, Js::RegSlot objectLocation, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    ParseNode *pmemberList = memberList;
    unsigned int argCount = 0;
    uint32  value;
    Js::PropertyId propertyId;

    //
    // 1. Add all non-int property ids to a dictionary propertyIds with value true
    // 2. Get the count of propertyIds
    // 3. Create a propertyId array of size count
    // 4. Put the propIds in the auxiliary area
    // 5. Get the objectLiteralCacheId
    // 6. Generate propId inits with values
    //

    // Handle propertyId collision
    typedef JsUtil::BaseHashSet<Js::PropertyId, ArenaAllocator, PowerOf2SizePolicy> PropertyIdSet;
    PropertyIdSet* propertyIds = Anew(byteCodeGenerator->GetAllocator(), PropertyIdSet, byteCodeGenerator->GetAllocator(), 17);

    bool hasComputedNameOrSpread = false;
    if (memberList != nullptr)
    {
        while (memberList->nop == knopList)
        {
            if (memberList->AsParseNodeBin()->pnode1->nop == knopEllipsis || memberList->AsParseNodeBin()->pnode1->AsParseNodeBin()->pnode1->nop == knopComputedName)
            {
                hasComputedNameOrSpread = true;
                break;
            }

            propertyId = memberList->AsParseNodeBin()->pnode1->AsParseNodeBin()->pnode1->AsParseNodeStr()->pid->GetPropertyId();
            if (!byteCodeGenerator->GetScriptContext()->IsNumericPropertyId(propertyId, &value))
            {
                propertyIds->Item(propertyId);
            }

            memberList = memberList->AsParseNodeBin()->pnode2;
        }

        if (memberList->nop != knopEllipsis && memberList->AsParseNodeBin()->pnode1->nop != knopComputedName && !hasComputedNameOrSpread)
        {
            propertyId = memberList->AsParseNodeBin()->pnode1->AsParseNodeStr()->pid->GetPropertyId();
            if (!byteCodeGenerator->GetScriptContext()->IsNumericPropertyId(propertyId, &value))
            {
                propertyIds->Item(propertyId);
            }
        }
    }

    argCount = propertyIds->Count();

    memberList = pmemberList;
    if ((memberList == nullptr) || (argCount == 0))
    {
        // Empty literal or numeric property only object literal
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::NewScObjectSimple, objectLocation);
    }
    else
    {
        uint32 allocSize = UInt32Math::Mul(argCount, sizeof(Js::PropertyId));
        Js::PropertyIdArray *propIds = AnewPlus(byteCodeGenerator->GetAllocator(), allocSize, Js::PropertyIdArray, argCount, 0);

        if (propertyIds->ContainsKey(Js::PropertyIds::__proto__))
        {
            // Always record whether the initializer contains __proto__ no matter if current environment has it enabled
            // or not, in case the bytecode is later run with __proto__ enabled.
            propIds->has__proto__ = true;
        }

        unsigned int argIndex = 0;
        while (memberList->nop == knopList)
        {
            if (memberList->AsParseNodeBin()->pnode1->nop == knopEllipsis || memberList->AsParseNodeBin()->pnode1->AsParseNodeBin()->pnode1->nop == knopComputedName)
            {
                break;
            }
            propertyId = memberList->AsParseNodeBin()->pnode1->AsParseNodeBin()->pnode1->AsParseNodeStr()->pid->GetPropertyId();
            if (!byteCodeGenerator->GetScriptContext()->IsNumericPropertyId(propertyId, &value) && propertyIds->Remove(propertyId))
            {
                propIds->elements[argIndex] = propertyId;
                argIndex++;
            }
            memberList = memberList->AsParseNodeBin()->pnode2;
        }

        if (memberList->nop != knopEllipsis && memberList->AsParseNodeBin()->pnode1->nop != knopComputedName && !hasComputedNameOrSpread)
        {
            propertyId = memberList->AsParseNodeBin()->pnode1->AsParseNodeStr()->pid->GetPropertyId();
            if (!byteCodeGenerator->GetScriptContext()->IsNumericPropertyId(propertyId, &value) && propertyIds->Remove(propertyId))
            {
                propIds->elements[argIndex] = propertyId;
                argIndex++;
            }
        }

        uint32 literalObjectId = funcInfo->GetParsedFunctionBody()->NewObjectLiteral();

        // Generate the opcode with propIds and cacheId
        byteCodeGenerator->Writer()->Auxiliary(Js::OpCode::NewScObjectLiteral, objectLocation, propIds, UInt32Math::Add(sizeof(Js::PropertyIdArray), allocSize), literalObjectId);

        Adelete(byteCodeGenerator->GetAllocator(), propertyIds);

        AdeletePlus(byteCodeGenerator->GetAllocator(), allocSize, propIds);
    }

    memberList = pmemberList;

    bool useStore = false;
    // Generate the actual assignment to those properties
    if (memberList != nullptr)
    {
        while (memberList->nop == knopList)
        {
            ParseNode *memberNode = memberList->AsParseNodeBin()->pnode1;
            if (memberNode->nop == knopEllipsis) 
            {
                byteCodeGenerator->StartSubexpression(memberNode);
                EmitObjectSpreadNode(memberNode, objectLocation, byteCodeGenerator, funcInfo);
                byteCodeGenerator->EndSubexpression(memberNode);
            }
            else
            {
                if (memberNode->AsParseNodeBin()->pnode1->nop == knopComputedName)
                {
                    useStore = true;
                }

                byteCodeGenerator->StartSubexpression(memberNode);
                EmitMemberNode(memberNode, objectLocation, byteCodeGenerator, funcInfo, nullptr, useStore);
                byteCodeGenerator->EndSubexpression(memberNode);
            }
            memberList = memberList->AsParseNodeBin()->pnode2;
        }

        byteCodeGenerator->StartSubexpression(memberList);
        if (memberList->nop == knopEllipsis)
        {
            EmitObjectSpreadNode(memberList, objectLocation, byteCodeGenerator, funcInfo);
        }
        else
        {
            EmitMemberNode(memberList, objectLocation, byteCodeGenerator, funcInfo, nullptr, useStore);
        }
        byteCodeGenerator->EndSubexpression(memberList);
    }
}